

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version_number.cpp
# Opt level: O0

uint ON_GetVersionWideString
               (uint major_version,uint minor_version,uint year,uint month,uint day_of_month,
               uint hour,uint minute,uint branch,size_t string_buffer_capacity,
               wchar_t *string_buffer)

{
  bool bVar1;
  uint local_48;
  uint local_44;
  uint i;
  uint string_length;
  size_t s_capacity;
  char s [24];
  uint hour_local;
  uint day_of_month_local;
  uint month_local;
  uint year_local;
  uint minor_version_local;
  uint major_version_local;
  
  s._16_4_ = hour;
  s._20_4_ = day_of_month;
  memset(&s_capacity,0,0x18);
  local_44 = ON_GetVersionString(major_version,minor_version,year,month,s._20_4_,s._16_4_,minute,
                                 branch,0x18,(char *)&s_capacity);
  if ((string_buffer_capacity != 0) && (string_buffer != (wchar_t *)0x0)) {
    if (string_buffer_capacity < local_44) {
      local_44 = 0;
      local_48 = 0;
    }
    else {
      local_48 = 0;
      while( true ) {
        bVar1 = false;
        if (local_48 < local_44) {
          bVar1 = s[(ulong)local_48 - 8] != '\0';
        }
        if (!bVar1) break;
        string_buffer[local_48] = (int)s[(ulong)local_48 - 8];
        local_48 = local_48 + 1;
      }
    }
    while (local_48 < string_buffer_capacity) {
      string_buffer[local_48] = L'\0';
      local_48 = local_48 + 1;
    }
  }
  return local_44;
}

Assistant:

unsigned int ON_GetVersionWideString(
  unsigned int major_version,
  unsigned int minor_version,
  unsigned int year,
  unsigned int month,
  unsigned int day_of_month,
  unsigned int hour,
  unsigned int minute,
  unsigned int branch,
  size_t string_buffer_capacity,
  wchar_t* string_buffer
  )
{
  char s[24] = {0};
  const size_t s_capacity = sizeof(s)/sizeof(s[0]);
  unsigned int string_length;
  unsigned int i;

  string_length = ON_GetVersionString(
                    major_version,
                    minor_version,
                    year,
                    month,
                    day_of_month,
                    hour,
                    minute,
                    branch,
                    s_capacity, s
                    );
  
  if (string_buffer_capacity > 0 && nullptr != string_buffer)
  {
    if (((size_t)string_length) <= string_buffer_capacity)
    {
      for (i = 0; i < string_length && 0 != s[i]; i++)
      {
        string_buffer[i] = s[i];
      }
    }
    else
    {
      string_length = 0;
      i = 0;
    }

    while (i < string_buffer_capacity)
      string_buffer[i++] = 0;
  }
  
  return string_length;
}